

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  char cVar1;
  FORM *form;
  int iVar2;
  FIELD *field;
  FIELD *pFVar3;
  ulong uVar4;
  byte bVar5;
  char debugMessage [128];
  
  form = (fm->super_cmCursesForm).Form;
  if (((((this->super_cmCursesWidget).field_0x3c == '\0') && (iVar2 = *key, iVar2 != 10)) &&
      (iVar2 != 0x157)) && (iVar2 != 0x69)) {
    bVar5 = 0;
  }
  else {
    (this->OriginalString)._M_string_length = 0;
    *(this->OriginalString)._M_dataplus._M_p = '\0';
    this->Done = false;
    bVar5 = 0;
    while ((bVar5 & 1) == 0) {
      snprintf(debugMessage,0x80,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(debugMessage);
      cmCursesMainForm::PrintKeys(fm,0);
      if (((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) || (*(short *)(_stdscr + 4) < 5)) {
        if (*key != 0x71) goto LAB_001509e0;
        break;
      }
      cVar1 = (this->super_cmCursesWidget).field_0x3c;
      iVar2 = *key;
      if (cVar1 == '\0') {
        if (iVar2 != 10) {
          if (iVar2 == 0x69) goto LAB_00150a08;
          if (iVar2 != 0x157) break;
        }
LAB_00150a5b:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
        goto LAB_00150a6a;
      }
      if ((iVar2 == 10) || (iVar2 == 0x157)) goto LAB_00150a5b;
LAB_00150a08:
      if (iVar2 == 0x69 && cVar1 == '\0') goto LAB_00150a5b;
      switch(iVar2) {
      case 1:
switchD_00150ad4_caseD_106:
        iVar2 = 0x216;
        break;
      case 2:
switchD_00150ad4_caseD_104:
        iVar2 = 0x211;
        break;
      case 3:
      case 7:
      case 8:
      case 10:
      case 0xc:
      case 0xd:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
switchD_00150ab5_caseD_3:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
        goto LAB_00150a6a;
      case 4:
      case 0xe:
      case 0x10:
      case 0x15:
        goto switchD_00150ad4_caseD_102;
      case 5:
switchD_00150ab5_caseD_5:
        iVar2 = 0x217;
        break;
      case 6:
switchD_00150ad4_caseD_105:
        iVar2 = 0x210;
        break;
      case 9:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
        goto LAB_00150a6a;
      case 0xb:
        iVar2 = 0x225;
        break;
      case 0x1b:
        if (cVar1 == '\0') goto LAB_00150a6a;
        (this->super_cmCursesWidget).field_0x3c = 0;
        cmCursesMainForm::PrintKeys(fm,0);
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,&this->OriginalString);
        (this->OriginalString)._M_string_length = 0;
        *(this->OriginalString)._M_dataplus._M_p = '\0';
        if (w == (WINDOW *)0x0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = (ulong)((int)w->_maxy + 1);
        }
        wtouchln(w,0,uVar4,1);
        wrefresh(w);
        bVar5 = 1;
        goto LAB_00150bc2;
      default:
        switch(iVar2) {
        case 0x102:
        case 0x103:
          break;
        case 0x104:
          goto switchD_00150ad4_caseD_104;
        case 0x105:
          goto switchD_00150ad4_caseD_105;
        case 0x106:
          goto switchD_00150ad4_caseD_106;
        case 0x107:
switchD_00150ad4_caseD_107:
          field = current_field(form);
          form_driver(form,0x222);
          pFVar3 = current_field(form);
          if (pFVar3 != field) {
            set_current_field(form,field);
          }
          goto LAB_00150a6a;
        default:
          if (iVar2 == 0x7f) goto switchD_00150ad4_caseD_107;
          if (iVar2 == 0x14a) {
            iVar2 = 0x221;
            goto LAB_00150b95;
          }
          if (iVar2 == 0x168) goto switchD_00150ab5_caseD_5;
          if (1 < iVar2 - 0x152U) goto switchD_00150ab5_caseD_3;
        }
        goto switchD_00150ad4_caseD_102;
      }
LAB_00150b95:
      form_driver(form,iVar2);
LAB_00150a6a:
      if (this->Done == false) {
        uVar4 = 0xffffffffffffffff;
        if (w != (WINDOW *)0x0) {
          uVar4 = (ulong)((int)w->_maxy + 1);
        }
        wtouchln(w,0,uVar4,1);
        wrefresh(w);
LAB_001509e0:
        iVar2 = wgetch(_stdscr);
        *key = iVar2;
      }
      bVar5 = this->Done;
    }
  }
LAB_00150bc2:
  return (bool)(bVar5 & 1);
switchD_00150ad4_caseD_102:
  bVar5 = 0;
  (this->super_cmCursesWidget).field_0x3c = 0;
  (this->OriginalString)._M_string_length = 0;
  *(this->OriginalString)._M_dataplus._M_p = '\0';
  form_driver(form,0x204);
  form_driver(form,0x205);
  goto LAB_00150bc2;
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x;
  int y;

  FORM* form = fm->GetForm();
  // when not in edit mode, edit mode is entered by pressing enter or i (vim
  // binding)
  // 10 == enter
  if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
    return false;
  }

  this->OriginalString.clear();
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while (!this->Done) {
    snprintf(debugMessage, sizeof(debugMessage),
             "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        return false;
      }
      key = getch();
      continue;
    }

    // If resize occurred during edit, move out of edit mode
    if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
      return false;
    }
    // toggle edit with return
    if ((key == 10 || key == KEY_ENTER)
        // enter edit with i (and not-edit mode)
        || (!this->InEdit && key == 'i')) {
      this->OnReturn(fm, w);
    } else if (key == KEY_DOWN || key == ctrl('n') || key == KEY_UP ||
               key == ctrl('p') || key == KEY_NPAGE || key == ctrl('d') ||
               key == KEY_PPAGE || key == ctrl('u')) {
      this->InEdit = false;
      this->OriginalString.clear();
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
    }
    // esc
    else if (key == 27) {
      if (this->InEdit) {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        this->OriginalString.clear();
        touchwin(w);
        wrefresh(w);
        return true;
      }
    } else if (key == 9) {
      this->OnTab(fm, w);
    } else if (key == KEY_LEFT || key == ctrl('b')) {
      form_driver(form, REQ_PREV_CHAR);
    } else if (key == KEY_RIGHT || key == ctrl('f')) {
      form_driver(form, REQ_NEXT_CHAR);
    } else if (key == ctrl('k')) {
      form_driver(form, REQ_CLR_EOL);
    } else if (key == ctrl('a') || key == KEY_HOME) {
      form_driver(form, REQ_BEG_FIELD);
    } else if (key == ctrl('e') || key == KEY_END) {
      form_driver(form, REQ_END_FIELD);
    } else if (key == 127 || key == KEY_BACKSPACE) {
      FIELD* cur = current_field(form);
      form_driver(form, REQ_DEL_PREV);
      if (current_field(form) != cur) {
        set_current_field(form, cur);
      }
    } else if (key == ctrl('d') || key == KEY_DC) {
      form_driver(form, REQ_DEL_CHAR);
    } else {
      this->OnType(key, fm, w);
    }
    if (!this->Done) {
      touchwin(w);
      wrefresh(w);

      key = getch();
    }
  }
  return true;
}